

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

Var Js::RegexHelper::RegexEs6ReplaceImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              RecyclableObject *replaceFn)

{
  size_t size;
  Recycler *this;
  RecyclableObject *instance;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  charcount_t cVar4;
  CharCount CVar5;
  charcount_t offset;
  CharCount startIndex;
  Recycler *pRVar6;
  List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Var pvVar7;
  JavascriptString *pJVar8;
  TempArenaAllocatorObject *tempAllocator;
  undefined4 *puVar9;
  int64 iVar10;
  JavascriptString *instance_00;
  uint64 uVar11;
  char *addr;
  ScriptContext *input_00;
  uint64 uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  CharCount in_stack_fffffffffffffcd8;
  undefined1 local_320 [8];
  TrackAllocData data;
  CompoundString *local_110;
  ScriptContext *local_f8;
  ScriptContext *scriptContext_local;
  JavascriptString *input_local;
  RecyclableObject *replaceFn_local;
  TrackAllocData data_1;
  char *local_48;
  CharCount substringLength;
  
  data_1._32_8_ = &local_f8;
  local_f8 = scriptContext;
  scriptContext_local = (ScriptContext *)input;
  input_local = (JavascriptString *)replaceFn;
  bVar2 = JavascriptRegExp::GetGlobalProperty(thisObj,scriptContext);
  if (bVar2) {
    JavascriptRegExp::GetUnicodeProperty(thisObj,scriptContext);
    JavascriptRegExp::SetLastIndexProperty(thisObj,&DAT_1000000000000,scriptContext);
  }
  this = scriptContext->recycler;
  local_320 = (undefined1  [8])
              &JsUtil::
               List<Js::RecyclableObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
               ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_8b5ecf4;
  data.filename._0_4_ = 0x3fd;
  pRVar6 = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_320);
  this_00 = (List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::Recycler>(0x30,pRVar6,0x387914);
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).alloc =
       this;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01534510;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).buffer.
  ptr = (WriteBarrierPtr<Js::RecyclableObject> *)0x0;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).count = 0
  ;
  this_00->length = 0;
  this_00->increment = 4;
  pvVar7 = JavascriptRegExp::CallExec
                     (thisObj,input,L"RegExp.prototype[Symbol.replace]",scriptContext);
  BVar3 = JavascriptOperators::IsNull(pvVar7);
  if (BVar3 == 0) {
    do {
      local_320 = (undefined1  [8])ExecResultToRecyclableObject(pvVar7);
      JsUtil::
      List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      Add(this_00,(RecyclableObject **)local_320);
      if (!bVar2) break;
      pvVar7 = JavascriptOperators::GetItem((RecyclableObject *)local_320,0,scriptContext);
      input_00 = scriptContext;
      pJVar8 = JavascriptConversion::ToString(pvVar7,scriptContext);
      AdvanceLastIndex(thisObj,(JavascriptString *)input_00,pJVar8,false,scriptContext);
      pvVar7 = JavascriptRegExp::CallExec
                         (thisObj,input,L"RegExp.prototype[Symbol.replace]",scriptContext);
      BVar3 = JavascriptOperators::IsNull(pvVar7);
    } while (BVar3 == 0);
  }
  CompoundString::Builder<256U>::Builder((Builder<256U> *)local_320,scriptContext);
  cVar4 = JavascriptString::GetLength(input);
  tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"RegexHelper");
  startIndex = 0;
  if (0 < (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).
          count) {
    startIndex = 0;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_48 = (char *)0x0;
    lVar15 = 0;
    uVar13 = 0;
    do {
      instance = (this_00->
                 super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).
                 buffer.ptr[lVar15].ptr;
      pvVar7 = JavascriptOperators::GetProperty
                         (instance,0xd1,scriptContext,(PropertyValueInfo *)0x0);
      iVar10 = JavascriptConversion::ToLength(pvVar7,scriptContext);
      uVar11 = iVar10 - 1;
      uVar12 = 0;
      if (0 < (long)uVar11) {
        uVar12 = uVar11;
      }
      pvVar7 = JavascriptOperators::GetItem(instance,0,scriptContext);
      pJVar8 = JavascriptConversion::ToString(pvVar7,scriptContext);
      pvVar7 = JavascriptOperators::GetProperty
                         (instance,0x1da,scriptContext,(PropertyValueInfo *)0x0);
      iVar10 = JavascriptConversion::ToLength(pvVar7,scriptContext);
      CVar5 = JavascriptRegExp::GetIndexOrMax(iVar10);
      if (cVar4 <= CVar5) {
        CVar5 = cVar4;
      }
      uVar14 = 99;
      if ((long)uVar12 < 99) {
        uVar14 = uVar12;
      }
      if (local_48 == (char *)0x0) {
        data_1.plusSize = uVar14 + 1;
        replaceFn_local = (RecyclableObject *)&Memory::WriteBarrierPtr<void>::typeinfo;
        data_1.typeinfo = (type_info *)0x0;
        data_1.count = (size_t)anon_var_dwarf_8b5ecf4;
        data_1.filename._0_4_ = 0x432;
        pRVar6 = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)&replaceFn_local);
        BVar3 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar3 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar2) goto LAB_00d3d6dc;
          *puVar9 = 0;
        }
        size = uVar14 * 8 + 8;
        local_48 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                             (pRVar6,size);
        if (local_48 == (char *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar2) goto LAB_00d3d6dc;
          *puVar9 = 0;
        }
        memset(local_48,0,size);
      }
      else if (uVar14 != uVar13) {
        local_48 = Memory::Recycler::Realloc(this,local_48,uVar13 * 8 + 8,uVar14 * 8 + 8,true);
      }
      if (0 < (long)uVar11) {
        uVar11 = 1;
        addr = local_48;
        do {
          addr = addr + 8;
          instance_00 = (JavascriptString *)
                        JavascriptOperators::GetItem(instance,uVar11,scriptContext);
          BVar3 = JavascriptOperators::IsUndefined(instance_00);
          if (BVar3 == 0) {
            instance_00 = JavascriptConversion::ToString(instance_00,scriptContext);
          }
          if (uVar11 <= uVar14) {
            Memory::Recycler::WBSetBit(addr);
            *(JavascriptString **)addr = instance_00;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          }
          bVar2 = uVar11 != uVar12;
          uVar11 = uVar11 + 1;
        } while (bVar2);
      }
      if (startIndex <= CVar5) {
        if (local_110 == (CompoundString *)0x0) {
          CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                    (input,startIndex,CVar5 - startIndex,(Builder<256U> *)local_320,false);
        }
        else {
          CompoundString::Append(local_110,input,startIndex,CVar5 - startIndex);
        }
        RegexEs6ReplaceImpl::anon_class_24_3_9375e38d::operator()
                  ((anon_class_24_3_9375e38d *)&data_1.line,(Builder<256U> *)local_320,
                   (ArenaAllocator *)pJVar8,(JavascriptString *)(uVar14 & 0xffffffff),(int)local_48,
                   (Type *)(ulong)CVar5,in_stack_fffffffffffffcd8);
        offset = JavascriptString::GetLength(pJVar8);
        startIndex = JavascriptRegExp::AddIndex(CVar5,offset);
      }
      lVar15 = lVar15 + 1;
      uVar13 = uVar14;
    } while (lVar15 < (this_00->
                      super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>)
                      .count);
  }
  ScriptContext::ReleaseTemporaryAllocator(scriptContext,tempAllocator);
  CVar5 = cVar4 - startIndex;
  if (startIndex <= cVar4 && CVar5 != 0) {
    if (local_110 == (CompoundString *)0x0) {
      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                (input,startIndex,CVar5,(Builder<256U> *)local_320,false);
    }
    else {
      CompoundString::Append(local_110,input,startIndex,CVar5);
    }
  }
  pJVar8 = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_320);
  if (pJVar8 == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x45f,"(accumulatedResult != nullptr)",
                                "accumulatedResult != nullptr");
    if (!bVar2) {
LAB_00d3d6dc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar9 = 0;
  }
  return pJVar8;
}

Assistant:

Var RegexHelper::RegexEs6ReplaceImpl(ScriptContext* scriptContext, RecyclableObject* thisObj, JavascriptString* input, RecyclableObject* replaceFn)
    {
        auto appendReplacement = [&](
            CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)>& resultBuilder,
            ArenaAllocator* tempAlloc,
            JavascriptString* matchStr,
            int numberOfCaptures,
            Field(Var)* captures,
            CharCount position)
        {
            // replaceFn Arguments:
            //
            // 0: this
            // 1: matched
            // 2: capture1
            // ...
            // N + 1: capture N
            // N + 2: position
            // N + 3: input

            // Number of captures can be at most 99, so we won't overflow.
            ushort argCount = (ushort) numberOfCaptures + 4;

            PROBE_STACK_NO_DISPOSE(scriptContext, argCount * sizeof(Var));

            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Var* args = (Var*) _alloca(argCount * sizeof(Var));

            args[0] = scriptContext->GetLibrary()->GetUndefined();
#pragma prefast(suppress:6386, "The write is within the bounds")
            args[1] = matchStr;
            for (int i = 1; i <= numberOfCaptures; ++i)
            {
                args[i + 1] = captures[i];
            }
            args[numberOfCaptures + 2] = JavascriptNumber::ToVar(position, scriptContext);
            args[numberOfCaptures + 3] = input;
            Js::Var replaceFnResult = threadContext->ExecuteImplicitCall(replaceFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
            {
                return JavascriptFunction::CallFunction<true>(replaceFn, replaceFn->GetEntryPoint(), Arguments(CallInfo(argCount), args));
            });
            JavascriptString* replace = JavascriptConversion::ToString(replaceFnResult, scriptContext);

            resultBuilder.Append(replace);
        };
        return RegexEs6ReplaceImpl(scriptContext, thisObj, input, appendReplacement, /* noResult */ false);
    }